

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O2

NodeRecordMB4D * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::UserGeometry>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::UserGeometry,_embree::Object>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::UserGeometry>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::UserGeometry,_embree::Object>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  size_t *psVar1;
  atomic<unsigned_long> *paVar2;
  char *pcVar3;
  float fVar4;
  uint uVar5;
  undefined4 uVar6;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar7;
  PrimRefMB *pPVar8;
  MemoryMonitorInterface *pMVar9;
  mvector<embree::PrimRefMB> *pmVar10;
  code *pcVar11;
  ThreadLocal2 *pTVar12;
  Scene *pSVar13;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar14;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  BBox1f BVar22;
  BBox1f BVar23;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar24;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar25;
  undefined8 uVar26;
  byte bVar27;
  char cVar28;
  mvector<PrimRefMB> *prims;
  long lVar29;
  __uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
  _Var30;
  void *pvVar31;
  size_t sVar32;
  undefined8 *puVar33;
  runtime_error *prVar34;
  long lVar35;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *pvVar36;
  float *pfVar37;
  unsigned_long uVar38;
  range<unsigned_long> *prVar39;
  Split *pSVar40;
  char *pcVar41;
  int iVar42;
  size_t sVar43;
  ulong uVar44;
  ulong uVar45;
  unsigned_long uVar46;
  size_t i_3;
  SetMB *this_00;
  byte bVar47;
  int iVar48;
  LocalChildListSplit *in_00;
  ulong uVar49;
  BBox1f *pBVar50;
  int iVar51;
  size_t i_5;
  Split *pSVar52;
  bool bVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar64;
  undefined1 auVar65 [16];
  float fVar66;
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar77;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar79;
  float fVar80;
  undefined1 auVar78 [16];
  float fVar81;
  float fVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar87;
  float fVar88;
  undefined1 auVar86 [16];
  float fVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar92;
  float fVar97;
  float fVar98;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar99;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  task_group_context *in_stack_ffffffffffffe188;
  undefined1 local_1e68 [16];
  undefined1 local_1e58 [16];
  ulong local_1e40;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  undefined1 local_1e18 [16];
  BBox1f time_range1;
  BBox1f time_range0;
  undefined1 local_1dd8 [16];
  _Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  local_1db8;
  PrimRefVector lprims;
  BBox<embree::Vec3fa> bi;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1d88;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aaStack_1d78 [7];
  anon_class_1_0_00000001 reduction;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_1c88 [16];
  PrimInfoMB right;
  BBox<embree::Vec3fa> blower1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1bc8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1bb8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ba8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b98 [4];
  BBox1f local_1b50;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_1b48;
  anon_class_24_3_c5d13451 isLeft;
  unsigned_long local_1a98;
  unsigned_long local_1a90;
  BBox<embree::Vec3fa> bupper0;
  BBox1f local_19d0;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_19c8;
  vint vSplitPos;
  BuildRecordSplit current;
  LocalChildListSplit children;
  NodeRecordMB4D values [16];
  
  children.children.items[0].super_BuildRecord.depth = in->depth;
  if ((this->cfg).maxDepth < children.children.items[0].super_BuildRecord.depth) {
    puVar33 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&children,"depth limit reached",(allocator *)values);
    *puVar33 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar33 + 1) = 1;
    std::__cxx11::string::string((string *)(puVar33 + 2),(string *)&children);
    __cxa_throw(puVar33,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  SetMB::SetMB(&children.children.items[0].super_BuildRecord.prims,&in->prims);
  findFallback((Split *)values,this,&in->prims);
  BuildRecord::BuildRecord(&current.super_BuildRecord,(BuildRecord *)&children);
  current.split.sah = (float)values[0].ref.ptr;
  current.split.dim = (int)values[0].ref.ptr._4_4_;
  current.split.mapping.ofs.field_0._0_8_ = values[0].lbounds.bounds0.upper.field_0._0_8_;
  current.split.mapping.ofs.field_0._8_8_ = values[0].lbounds.bounds0.upper.field_0._8_8_;
  current.split.mapping.scale.field_0._0_8_ = values[0].lbounds.bounds1.lower.field_0._0_8_;
  current.split.mapping.scale.field_0._8_8_ = values[0].lbounds.bounds1.lower.field_0._8_8_;
  uVar46 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
  if (current.super_BuildRecord.depth == 1) {
    if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end ==
        current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin) {
      bVar47 = 0;
      uVar46 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
    }
    else {
      lVar29 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin * 0x50 + 0x40;
      auVar61 = ZEXT816(0xff8000007f800000);
      for (uVar38 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
          uVar38 < current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
          uVar38 = uVar38 + 1) {
        auVar70._8_8_ = 0;
        auVar70._0_8_ =
             *(ulong *)((long)&((current.super_BuildRecord.prims.prims)->items->lbounds).bounds0.
                               lower.field_0 + lVar29);
        auVar57 = vcmpps_avx(auVar61,auVar70,1);
        auVar71 = vinsertps_avx(auVar61,auVar70,0x50);
        auVar61 = vblendps_avx(auVar70,auVar61,2);
        auVar61 = vblendvps_avx(auVar61,auVar71,auVar57);
        lVar29 = lVar29 + 0x50;
      }
      auVar57 = vmovshdup_avx(auVar61);
      auVar57 = vcmpps_avx(auVar57,ZEXT416((uint)current.super_BuildRecord.prims.super_PrimInfoMB.
                                                 time_range.upper),1);
      auVar61 = vcmpps_avx(ZEXT416((uint)current.super_BuildRecord.prims.super_PrimInfoMB.time_range
                                         .lower),auVar61,1);
      auVar61 = vorps_avx(auVar61,auVar57);
      bVar47 = auVar61[0] & 1;
    }
  }
  else {
    bVar47 = 0;
  }
  uVar44 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end - uVar46;
  if (((uVar44 <= (this->cfg).maxLeafSize) && ((uint)values[0]._12_4_ < 2)) && (bVar47 == 0)) {
    bupper0.lower.field_0._0_8_ = uVar44 * 8;
    pTVar12 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar12->alloc)._M_b._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = (size_t)pTVar12;
      MutexSys::lock(&pTVar12->mutex);
      if ((pTVar12->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar12->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar12->alloc1).bytesUsed + (pTVar12->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar12->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar12->alloc0).end + (pTVar12->alloc1).end) -
             ((pTVar12->alloc0).cur + (pTVar12->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar12->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar12->alloc1).bytesWasted + (pTVar12->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar63 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar12->alloc0).end = auVar63._0_8_;
      (pTVar12->alloc0).allocBlockSize = auVar63._8_8_;
      (pTVar12->alloc0).bytesUsed = auVar63._16_8_;
      (pTVar12->alloc0).bytesWasted = auVar63._24_8_;
      (pTVar12->alloc0).ptr = (char *)auVar63._0_8_;
      (pTVar12->alloc0).cur = auVar63._8_8_;
      (pTVar12->alloc0).end = auVar63._16_8_;
      (pTVar12->alloc0).allocBlockSize = auVar63._24_8_;
      auVar63 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar12->alloc1).end = auVar63._0_8_;
        (pTVar12->alloc1).allocBlockSize = auVar63._8_8_;
        (pTVar12->alloc1).bytesUsed = auVar63._16_8_;
        (pTVar12->alloc1).bytesWasted = auVar63._24_8_;
        (pTVar12->alloc1).ptr = (char *)auVar63._0_8_;
        (pTVar12->alloc1).cur = auVar63._8_8_;
        (pTVar12->alloc1).end = auVar63._16_8_;
        (pTVar12->alloc1).allocBlockSize = auVar63._24_8_;
      }
      else {
        (pTVar12->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar12->alloc1).ptr = (char *)auVar63._0_8_;
        (pTVar12->alloc1).cur = auVar63._8_8_;
        (pTVar12->alloc1).end = auVar63._16_8_;
        (pTVar12->alloc1).allocBlockSize = auVar63._24_8_;
        (pTVar12->alloc1).end = auVar63._0_8_;
        (pTVar12->alloc1).allocBlockSize = auVar63._8_8_;
        (pTVar12->alloc1).bytesUsed = auVar63._16_8_;
        (pTVar12->alloc1).bytesWasted = auVar63._24_8_;
        (pTVar12->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar12->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      children.children.items[0].super_BuildRecord.depth =
           (size_t)&FastAllocator::s_thread_local_allocators_lock;
      children.children.items[0].super_BuildRecord._8_1_ = 1;
      blower1.lower.field_0._0_8_ = pTVar12;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&blower1);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&children);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)values);
    }
    uVar26 = bupper0.lower.field_0._0_8_;
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + bupper0.lower.field_0._0_8_;
    sVar32 = (alloc.talloc1)->cur;
    uVar49 = (ulong)(-(int)sVar32 & 0xf);
    uVar45 = sVar32 + bupper0.lower.field_0._0_8_ + uVar49;
    (alloc.talloc1)->cur = uVar45;
    if ((alloc.talloc1)->end < uVar45) {
      (alloc.talloc1)->cur = sVar32;
      uVar45 = (alloc.talloc1)->allocBlockSize;
      if ((ulong)(bupper0.lower.field_0._0_8_ * 4) < uVar45 ||
          bupper0.lower.field_0._0_8_ * 4 - uVar45 == 0) {
        children.children.items[0].super_BuildRecord.depth = uVar45;
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&children);
        (alloc.talloc1)->ptr = pcVar41;
        sVar32 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar32;
        (alloc.talloc1)->end = children.children.items[0].super_BuildRecord.depth;
        (alloc.talloc1)->cur = uVar26;
        if (children.children.items[0].super_BuildRecord.depth < (ulong)uVar26) {
          (alloc.talloc1)->cur = 0;
          children.children.items[0].super_BuildRecord.depth = (alloc.talloc1)->allocBlockSize;
          pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&children);
          (alloc.talloc1)->ptr = pcVar41;
          sVar32 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar32;
          (alloc.talloc1)->end = children.children.items[0].super_BuildRecord.depth;
          (alloc.talloc1)->cur = uVar26;
          if (children.children.items[0].super_BuildRecord.depth < (ulong)uVar26) {
            (alloc.talloc1)->cur = 0;
            pcVar41 = (char *)0x0;
            goto LAB_00cd58e5;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar32;
      }
      else {
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&bupper0);
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar49;
      pcVar41 = (alloc.talloc1)->ptr + (uVar45 - bupper0.lower.field_0._0_8_);
    }
LAB_00cd58e5:
    uVar45 = 7;
    if (uVar44 < 7) {
      uVar45 = uVar44;
    }
    aVar59.m128[2] = -INFINITY;
    aVar59._0_8_ = 0xff800000ff800000;
    aVar59.m128[3] = -INFINITY;
    aVar64.m128[2] = INFINITY;
    aVar64._0_8_ = 0x7f8000007f800000;
    aVar64.m128[3] = INFINITY;
    aVar15 = aVar64;
    aVar14 = aVar59;
    for (uVar49 = 0; uVar49 != uVar44; uVar49 = uVar49 + 1) {
      pSVar13 = ((this->createLeaf).bvh)->scene;
      auVar60._4_4_ = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
      auVar60._0_4_ = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
      auVar60._8_8_ = 0;
      fVar4 = (current.super_BuildRecord.prims.prims)->items[uVar46].lbounds.bounds0.lower.field_0.
              m128[3];
      fVar77 = (current.super_BuildRecord.prims.prims)->items[uVar46].lbounds.bounds0.upper.field_0.
               m128[3];
      isLeft.split = (Split *)(ulong)(uint)fVar77;
      *(float *)(pcVar41 + uVar49 * 8) = fVar4;
      *(float *)(pcVar41 + uVar49 * 8 + 4) = fVar77;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           (pSVar13->geometries).items[(uint)fVar4].ptr;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           &isLeft;
      fVar4 = ((Geometry *)
              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
              _0_8_)->fnumTimeSegments;
      fVar77 = (((Geometry *)
                right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_)->time_range).lower;
      fVar92 = (((Geometry *)
                right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_)->time_range).upper - fVar77;
      fVar66 = (current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower - fVar77) / fVar92
      ;
      auVar61 = vmovshdup_avx(auVar60);
      fVar92 = (auVar61._0_4_ - fVar77) / fVar92;
      fVar77 = fVar4 * fVar66;
      fVar82 = fVar4 * fVar92;
      auVar71 = vroundss_avx(ZEXT416((uint)fVar77),ZEXT416((uint)fVar77),9);
      auVar70 = vroundss_avx(ZEXT416((uint)fVar82),ZEXT416((uint)fVar82),10);
      auVar61 = vmaxss_avx(auVar71,ZEXT816(0) << 0x40);
      auVar57 = vminss_avx(auVar70,ZEXT416((uint)fVar4));
      iVar48 = (int)auVar61._0_4_;
      fVar67 = auVar57._0_4_;
      iVar51 = (int)auVar71._0_4_;
      iVar42 = -1;
      if (-1 < iVar51) {
        iVar42 = iVar51;
      }
      iVar16 = (int)fVar4 + 1;
      if ((int)auVar70._0_4_ < (int)fVar4 + 1) {
        iVar16 = (int)auVar70._0_4_;
      }
      AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
                ((BBox3fa *)&children,(anon_class_16_2_4e716a3c *)&right,(long)iVar48);
      AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
                ((BBox3fa *)values,(anon_class_16_2_4e716a3c *)&right,(long)(int)fVar67);
      fVar77 = fVar77 - auVar61._0_4_;
      if (iVar16 - iVar42 == 1) {
        auVar61 = vmaxss_avx(ZEXT416((uint)fVar77),ZEXT816(0) << 0x40);
        auVar57 = vshufps_avx(auVar61,auVar61,0);
        auVar61 = ZEXT416((uint)(1.0 - auVar61._0_4_));
        auVar61 = vshufps_avx(auVar61,auVar61,0);
        auVar86._0_4_ =
             auVar57._0_4_ * (float)values[0].ref.ptr +
             auVar61._0_4_ * (float)children.children.items[0].super_BuildRecord.depth;
        auVar86._4_4_ =
             auVar57._4_4_ * values[0].ref.ptr._4_4_ +
             auVar61._4_4_ * children.children.items[0].super_BuildRecord.depth._4_4_;
        auVar86._8_4_ =
             auVar57._8_4_ * (float)values[0]._8_4_ +
             auVar61._8_4_ * (float)children.children.items[0].super_BuildRecord._8_4_;
        auVar86._12_4_ =
             auVar57._12_4_ * (float)values[0]._12_4_ +
             auVar61._12_4_ * (float)children.children.items[0].super_BuildRecord._12_4_;
        auVar94._0_4_ =
             auVar57._0_4_ * (float)values[0].lbounds.bounds0.lower.field_0._0_4_ +
             auVar61._0_4_ *
             children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
             super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[0]
        ;
        auVar94._4_4_ =
             auVar57._4_4_ * (float)values[0].lbounds.bounds0.lower.field_0._4_4_ +
             auVar61._4_4_ *
             children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
             super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[1]
        ;
        auVar94._8_4_ =
             auVar57._8_4_ * (float)values[0].lbounds.bounds0.lower.field_0._8_4_ +
             auVar61._8_4_ *
             children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
             super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[2]
        ;
        auVar94._12_4_ =
             auVar57._12_4_ * (float)values[0].lbounds.bounds0.lower.field_0._12_4_ +
             auVar61._12_4_ *
             children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
             super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[3]
        ;
        auVar61 = vmaxss_avx(ZEXT416((uint)(fVar67 - fVar82)),ZEXT816(0) << 0x40);
        auVar57 = vshufps_avx(auVar61,auVar61,0);
        auVar61 = ZEXT416((uint)(1.0 - auVar61._0_4_));
        auVar61 = vshufps_avx(auVar61,auVar61,0);
        auVar75._0_4_ =
             auVar61._0_4_ * (float)values[0].ref.ptr +
             auVar57._0_4_ * (float)children.children.items[0].super_BuildRecord.depth;
        auVar75._4_4_ =
             auVar61._4_4_ * values[0].ref.ptr._4_4_ +
             auVar57._4_4_ * children.children.items[0].super_BuildRecord.depth._4_4_;
        auVar75._8_4_ =
             auVar61._8_4_ * (float)values[0]._8_4_ +
             auVar57._8_4_ * (float)children.children.items[0].super_BuildRecord._8_4_;
        auVar75._12_4_ =
             auVar61._12_4_ * (float)values[0]._12_4_ +
             auVar57._12_4_ * (float)children.children.items[0].super_BuildRecord._12_4_;
        auVar78._0_4_ =
             auVar61._0_4_ * (float)values[0].lbounds.bounds0.lower.field_0._0_4_ +
             auVar57._0_4_ *
             children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
             super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[0]
        ;
        auVar78._4_4_ =
             auVar61._4_4_ * (float)values[0].lbounds.bounds0.lower.field_0._4_4_ +
             auVar57._4_4_ *
             children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
             super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[1]
        ;
        auVar78._8_4_ =
             auVar61._8_4_ * (float)values[0].lbounds.bounds0.lower.field_0._8_4_ +
             auVar57._8_4_ *
             children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
             super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[2]
        ;
        auVar78._12_4_ =
             auVar61._12_4_ * (float)values[0].lbounds.bounds0.lower.field_0._12_4_ +
             auVar57._12_4_ *
             children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
             super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[3]
        ;
      }
      else {
        AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
                  (&blower1,(anon_class_16_2_4e716a3c *)&right,(long)(iVar48 + 1));
        AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
                  (&bupper0,(anon_class_16_2_4e716a3c *)&right,(long)((int)fVar67 + -1));
        auVar61 = vmaxss_avx(ZEXT416((uint)fVar77),ZEXT816(0) << 0x40);
        auVar57 = vshufps_avx(auVar61,auVar61,0);
        auVar61 = ZEXT416((uint)(1.0 - auVar61._0_4_));
        auVar61 = vshufps_avx(auVar61,auVar61,0);
        auVar86._0_4_ =
             auVar57._0_4_ * blower1.lower.field_0.m128[0] +
             auVar61._0_4_ * (float)children.children.items[0].super_BuildRecord.depth;
        auVar86._4_4_ =
             auVar57._4_4_ * blower1.lower.field_0.m128[1] +
             auVar61._4_4_ * children.children.items[0].super_BuildRecord.depth._4_4_;
        auVar86._8_4_ =
             auVar57._8_4_ * blower1.lower.field_0.m128[2] +
             auVar61._8_4_ * (float)children.children.items[0].super_BuildRecord._8_4_;
        auVar86._12_4_ =
             auVar57._12_4_ * blower1.lower.field_0.m128[3] +
             auVar61._12_4_ * (float)children.children.items[0].super_BuildRecord._12_4_;
        auVar94._0_4_ =
             auVar57._0_4_ * blower1.upper.field_0.m128[0] +
             auVar61._0_4_ *
             children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
             super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[0]
        ;
        auVar94._4_4_ =
             auVar57._4_4_ * blower1.upper.field_0.m128[1] +
             auVar61._4_4_ *
             children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
             super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[1]
        ;
        auVar94._8_4_ =
             auVar57._8_4_ * blower1.upper.field_0.m128[2] +
             auVar61._8_4_ *
             children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
             super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[2]
        ;
        auVar94._12_4_ =
             auVar57._12_4_ * blower1.upper.field_0.m128[3] +
             auVar61._12_4_ *
             children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
             super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[3]
        ;
        auVar61 = vmaxss_avx(ZEXT416((uint)(fVar67 - fVar82)),ZEXT816(0) << 0x40);
        auVar57 = vshufps_avx(auVar61,auVar61,0);
        auVar61 = ZEXT416((uint)(1.0 - auVar61._0_4_));
        auVar61 = vshufps_avx(auVar61,auVar61,0);
        auVar75._0_4_ =
             auVar57._0_4_ * bupper0.lower.field_0.m128[0] +
             auVar61._0_4_ * (float)values[0].ref.ptr;
        auVar75._4_4_ =
             auVar57._4_4_ * bupper0.lower.field_0.m128[1] + auVar61._4_4_ * values[0].ref.ptr._4_4_
        ;
        auVar75._8_4_ =
             auVar57._8_4_ * bupper0.lower.field_0.m128[2] + auVar61._8_4_ * (float)values[0]._8_4_;
        auVar75._12_4_ =
             auVar57._12_4_ * bupper0.lower.field_0.m128[3] +
             auVar61._12_4_ * (float)values[0]._12_4_;
        auVar78._0_4_ =
             auVar57._0_4_ * bupper0.upper.field_0.m128[0] +
             auVar61._0_4_ * (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
        auVar78._4_4_ =
             auVar57._4_4_ * bupper0.upper.field_0.m128[1] +
             auVar61._4_4_ * (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
        auVar78._8_4_ =
             auVar57._8_4_ * bupper0.upper.field_0.m128[2] +
             auVar61._8_4_ * (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
        auVar78._12_4_ =
             auVar57._12_4_ * bupper0.upper.field_0.m128[3] +
             auVar61._12_4_ * (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
        if (iVar51 < 0) {
          iVar51 = -1;
        }
        sVar32 = (size_t)iVar51;
        while (sVar32 = sVar32 + 1, (long)sVar32 < (long)iVar16) {
          auVar62._0_4_ = ((float)(int)sVar32 / fVar4 - fVar66) / (fVar92 - fVar66);
          auVar62._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar61 = vshufps_avx(auVar62,auVar62,0);
          fVar77 = auVar75._4_4_;
          fVar82 = auVar75._8_4_;
          fVar67 = auVar75._12_4_;
          auVar57 = vshufps_avx(ZEXT416((uint)(1.0 - auVar62._0_4_)),
                                ZEXT416((uint)(1.0 - auVar62._0_4_)),0);
          fVar87 = auVar86._4_4_;
          fVar88 = auVar86._8_4_;
          fVar89 = auVar86._12_4_;
          fVar79 = auVar78._4_4_;
          fVar80 = auVar78._8_4_;
          fVar81 = auVar78._12_4_;
          fVar97 = auVar94._4_4_;
          fVar98 = auVar94._8_4_;
          fVar99 = auVar94._12_4_;
          AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
                    (&bi,(anon_class_16_2_4e716a3c *)&right,sVar32);
          auVar18._4_4_ = bi.lower.field_0.m128[1];
          auVar18._0_4_ = bi.lower.field_0.m128[0];
          auVar18._8_4_ = bi.lower.field_0.m128[2];
          auVar18._12_4_ = bi.lower.field_0.m128[3];
          auVar17._4_4_ = fVar77 * auVar61._4_4_ + fVar87 * auVar57._4_4_;
          auVar17._0_4_ = auVar75._0_4_ * auVar61._0_4_ + auVar86._0_4_ * auVar57._0_4_;
          auVar17._8_4_ = fVar82 * auVar61._8_4_ + fVar88 * auVar57._8_4_;
          auVar17._12_4_ = fVar67 * auVar61._12_4_ + fVar89 * auVar57._12_4_;
          auVar71 = vsubps_avx(auVar18,auVar17);
          auVar19._4_4_ = bi.upper.field_0.m128[1];
          auVar19._0_4_ = bi.upper.field_0.m128[0];
          auVar19._8_4_ = bi.upper.field_0.m128[2];
          auVar19._12_4_ = bi.upper.field_0.m128[3];
          auVar20._4_4_ = fVar79 * auVar61._4_4_ + fVar97 * auVar57._4_4_;
          auVar20._0_4_ = auVar78._0_4_ * auVar61._0_4_ + auVar94._0_4_ * auVar57._0_4_;
          auVar20._8_4_ = fVar80 * auVar61._8_4_ + fVar98 * auVar57._8_4_;
          auVar20._12_4_ = fVar81 * auVar61._12_4_ + fVar99 * auVar57._12_4_;
          auVar61 = vsubps_avx(auVar19,auVar20);
          auVar57 = vminps_avx(auVar71,ZEXT816(0) << 0x40);
          auVar61 = vmaxps_avx(auVar61,ZEXT816(0) << 0x40);
          auVar86._0_4_ = auVar86._0_4_ + auVar57._0_4_;
          auVar86._4_4_ = fVar87 + auVar57._4_4_;
          auVar86._8_4_ = fVar88 + auVar57._8_4_;
          auVar86._12_4_ = fVar89 + auVar57._12_4_;
          auVar75._0_4_ = auVar75._0_4_ + auVar57._0_4_;
          auVar75._4_4_ = fVar77 + auVar57._4_4_;
          auVar75._8_4_ = fVar82 + auVar57._8_4_;
          auVar75._12_4_ = fVar67 + auVar57._12_4_;
          auVar94._0_4_ = auVar94._0_4_ + auVar61._0_4_;
          auVar94._4_4_ = fVar97 + auVar61._4_4_;
          auVar94._8_4_ = fVar98 + auVar61._8_4_;
          auVar94._12_4_ = fVar99 + auVar61._12_4_;
          auVar78._0_4_ = auVar78._0_4_ + auVar61._0_4_;
          auVar78._4_4_ = fVar79 + auVar61._4_4_;
          auVar78._8_4_ = fVar80 + auVar61._8_4_;
          auVar78._12_4_ = fVar81 + auVar61._12_4_;
        }
      }
      uVar46 = uVar46 + 1;
      aVar64.m128 = (__m128)vminps_avx(aVar64.m128,auVar86);
      aVar59.m128 = (__m128)vmaxps_avx(aVar59.m128,auVar94);
      aVar15.m128 = (__m128)vminps_avx(aVar15.m128,auVar75);
      aVar14.m128 = (__m128)vmaxps_avx(aVar14.m128,auVar78);
    }
    (__return_storage_ptr__->ref).ptr = uVar45 | (ulong)pcVar41 | 8;
    (__return_storage_ptr__->lbounds).bounds0.lower.field_0 = aVar64;
    (__return_storage_ptr__->lbounds).bounds0.upper.field_0 = aVar59;
    (__return_storage_ptr__->lbounds).bounds1.lower.field_0 = aVar15;
    (__return_storage_ptr__->lbounds).bounds1.upper.field_0 = aVar14;
    BVar22.upper = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
    BVar22.lower = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
    __return_storage_ptr__->dt = BVar22;
    return __return_storage_ptr__;
  }
  array_t<embree::avx::BVHBuilderMSMBlur::BuildRecordSplit,_16UL>::array_t
            ((array_t<embree::avx::BVHBuilderMSMBlur::BuildRecordSplit,_16UL> *)&children);
  children.numChildren = 1;
  local_1e40 = 1;
  children.numSharedPrimVecs = 1;
  BuildRecordSplit::operator=((BuildRecordSplit *)&children,&current);
  children.sharedPrimVecs.items[0].prims = current.super_BuildRecord.prims.prims;
  children.sharedPrimVecs.items[0].refCount = 2;
  children.primvecs.items[0] = children.sharedPrimVecs.items;
  bVar27 = 0;
  local_1dd8._8_4_ = 0x7f800000;
  local_1dd8._0_8_ = 0x7f8000007f800000;
  local_1dd8._12_4_ = 0x7f800000;
  local_1e18._8_4_ = 0xff800000;
  local_1e18._0_8_ = 0xff800000ff800000;
  local_1e18._12_4_ = 0xff800000;
  do {
    prVar39 = &children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.object_range;
    uVar44 = 0;
    sVar32 = 0xffffffffffffffff;
    for (sVar43 = 0; children.numChildren != sVar43; sVar43 = sVar43 + 1) {
      uVar45 = prVar39->_end - prVar39->_begin;
      if ((((this->cfg).maxLeafSize < uVar45) || (1 < *(uint *)((long)(prVar39 + 4) + 0xc))) ||
         (bVar47 != 0)) {
        if (uVar44 < uVar45) {
          sVar32 = sVar43;
          uVar44 = uVar45;
        }
        bVar47 = 0;
      }
      prVar39 = prVar39 + 0xf;
    }
    if (sVar32 == 0xffffffffffffffff) break;
    lVar29 = sVar32 * 0xf0;
    blower1.lower.field_0._0_8_ = current.super_BuildRecord.depth + 1;
    uVar5 = *(uint *)((long)values + lVar29 + -0x10d4);
    bupper0.lower.field_0._0_8_ = blower1.lower.field_0._0_8_;
    if (3 < uVar5) goto LAB_00cd4779;
    this_00 = &children.children.items[sVar32].super_BuildRecord.prims;
    switch(uVar5) {
    case 0:
      isLeft.split = (Split *)((long)values + lVar29 + -0x10e0);
      bi.lower.field_0.m128[0] = INFINITY;
      bi.lower.field_0.m128[1] = INFINITY;
      bi.lower.field_0.m128[2] = INFINITY;
      bi.lower.field_0.m128[3] = INFINITY;
      bi.upper.field_0.m128[0] = -INFINITY;
      bi.upper.field_0.m128[1] = -INFINITY;
      bi.upper.field_0.m128[2] = -INFINITY;
      bi.upper.field_0.m128[3] = -INFINITY;
      local_1d88.i[0] = 0x7f800000;
      local_1d88.i[1] = 0x7f800000;
      local_1d88.i[2] = 0x7f800000;
      local_1d88.i[3] = 0x7f800000;
      aaStack_1d78[0].i[0] = -INFINITY;
      aaStack_1d78[0].i[1] = -INFINITY;
      aaStack_1d78[0].i[2] = -INFINITY;
      aaStack_1d78[0].i[3] = -INFINITY;
      auVar71._8_4_ = 0x3f800000;
      auVar71._0_8_ = 0x3f8000003f800000;
      auVar71._12_4_ = 0x3f800000;
      vmovlps_avx(auVar71);
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[0]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[1]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[0]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[1]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
           -INFINITY;
      right.object_range._begin = 0;
      right.object_range._end = 0;
      right.num_time_segments = 0;
      right.max_num_time_segments = 0;
      right.max_time_range.lower = 0.0;
      right._132_8_ = vmovlps_avx(auVar71);
      right.time_range.upper = 0.0;
      vSplitPos.field_0.i[1] = *(undefined4 *)((long)values + lVar29 + -0x10d8);
      vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
      lVar35 = (long)(1 << (*(byte *)((long)values + lVar29 + -0x10dc) & 0x1f)) * 0x10;
      vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar35);
      vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar35 + 8);
      isLeft.vSplitPos = &vSplitPos;
      isLeft.vSplitMask = &vSplitMask;
      parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                (*(PrimRefMB **)(*(long *)((long)values + lVar29 + -0x10f0) + 0x20),
                 children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.
                 object_range._begin,
                 children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.
                 object_range._end,(EmptyTy *)local_1c88,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&bi,&right,&isLeft,&reduction,
                 &reduction2,0x80,0xc00);
      local_1b48 = *(vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                     **)((long)values + lVar29 + -0x10f0);
      local_1e68._8_8_ = 0;
      local_1e68._0_8_ = *(ulong *)((long)values + lVar29 + -0x10f8);
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&blower1.upper,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&bi);
      auVar54._8_8_ = 0;
      auVar54._0_4_ = local_1b50.lower;
      auVar54._4_4_ = local_1b50.upper;
      auVar57 = vcmpps_avx(auVar54,local_1e68,1);
      auVar71 = vinsertps_avx(local_1e68,auVar54,0x50);
      auVar61 = vblendps_avx(auVar54,local_1e68,2);
      auVar61 = vblendvps_avx(auVar61,auVar71,auVar57);
      local_1b50 = (BBox1f)vmovlps_avx(auVar61);
      local_19c8 = *(vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                     **)((long)values + lVar29 + -0x10f0);
      local_1e68._8_8_ = 0;
      local_1e68._0_8_ = *(ulong *)((long)values + lVar29 + -0x10f8);
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&bupper0.upper,&right);
      auVar55._8_8_ = 0;
      auVar55._0_4_ = local_19d0.lower;
      auVar55._4_4_ = local_19d0.upper;
      auVar57 = vcmpps_avx(auVar55,local_1e68,1);
      auVar71 = vinsertps_avx(local_1e68,auVar55,0x50);
      auVar61 = vblendps_avx(auVar55,local_1e68,2);
      auVar61 = vblendvps_avx(auVar61,auVar71,auVar57);
      local_19d0 = (BBox1f)vmovlps_avx(auVar61);
      break;
    case 1:
      SetMB::deterministic_order(this_00);
      splitFallback(this,this_00,(SetMB *)&blower1.upper,(SetMB *)&bupper0.upper);
      break;
    case 2:
      time_range1.lower = *(float *)((long)values + lVar29 + -0x10d8);
      time_range0.lower = *(float *)((long)values + lVar29 + -0x10f8);
      time_range1.upper = *(float *)((long)values + lVar29 + -0x10f4);
      pmVar10 = *(mvector<embree::PrimRefMB> **)((long)values + lVar29 + -0x10f0);
      time_range0.upper = time_range1.lower;
      _Var30.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )::operator_new(0x28);
      pMVar9 = (this->heuristicTemporalSplit).device;
      *(long *)((long)_Var30.
                      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      .
                      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                      ._M_head_impl + 0x20) = 0;
      pSVar40 = (Split *)children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.
                         object_range._end;
      uVar46 = children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._begin;
      *(MemoryMonitorInterface **)
       _Var30.
       super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       .
       super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
       ._M_head_impl = pMVar9;
      *(undefined1 *)
       ((long)_Var30.
              super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              .
              super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
              ._M_head_impl + 8) = 0;
      *(long *)((long)_Var30.
                      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      .
                      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                      ._M_head_impl + 0x10) = 0;
      *(long *)((long)_Var30.
                      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      .
                      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                      ._M_head_impl + 0x18) = 0;
      lVar29 = (long)pSVar40 - uVar46;
      pSVar52 = pSVar40;
      if (lVar29 != 0) {
        uVar44 = lVar29 * 0x50;
        (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,uVar44,0);
        if (uVar44 < 0x1c00000) {
          pvVar31 = alignedMalloc(uVar44,0x10);
        }
        else {
          pvVar31 = os_malloc(uVar44,(bool *)((long)_Var30.
                                                  super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                                                  ._M_head_impl + 8));
        }
        *(void **)((long)_Var30.
                         super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                         .
                         super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                         ._M_head_impl + 0x20) = pvVar31;
        *(long *)((long)_Var30.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl + 0x10) = lVar29;
        *(long *)((long)_Var30.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl + 0x18) = lVar29;
        pSVar40 = (Split *)children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.
                           object_range._begin;
        pSVar52 = (Split *)children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.
                           object_range._end;
      }
      vSplitMask.field_0._8_8_ = &time_range0;
      bi.lower.field_0.m128[0] = INFINITY;
      bi.lower.field_0.m128[1] = INFINITY;
      bi.lower.field_0.m128[2] = INFINITY;
      bi.lower.field_0.m128[3] = INFINITY;
      bi.upper.field_0.m128[0] = -INFINITY;
      bi.upper.field_0.m128[1] = -INFINITY;
      bi.upper.field_0.m128[2] = -INFINITY;
      bi.upper.field_0.m128[3] = -INFINITY;
      auVar61._8_4_ = 0x3f800000;
      auVar61._0_8_ = 0x3f8000003f800000;
      auVar61._12_4_ = 0x3f800000;
      uVar44 = vmovlps_avx(auVar61);
      new_vector._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )_Var30.
               super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl;
      lprims = (PrimRefVector)
               _Var30.
               super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl;
      vSplitMask.field_0._0_8_ = pmVar10;
      if ((ulong)((long)pSVar52 - (long)pSVar40) < 0xc00) {
        isLeft.split = pSVar40;
        isLeft.vSplitPos = (vint *)pSVar52;
        ::anon_func::anon_class_40_5_808acc65::operator()
                  (&right,(anon_class_40_5_808acc65 *)&vSplitMask,(range<unsigned_long> *)&isLeft);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&isLeft,(context_traits)0x4,CUSTOM_CTX);
        _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        vSplitPos.field_0.v[0] = (longlong)pSVar52;
        vSplitPos.field_0.v[1] = (longlong)pSVar40;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  (&right,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&bi,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                   (anon_class_16_2_ed117de8_conflict29 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&isLeft,in_stack_ffffffffffffe188);
        cVar28 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
        if (cVar28 != '\0') {
          prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar34,"task cancelled");
          __cxa_throw(prVar34,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&isLeft);
      }
      uVar46 = children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._end - children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.
                       object_range._begin;
      if (right.object_range._end - right.object_range._begin != uVar46) {
        bi.lower.field_0._0_8_ = &time_range0;
        right.object_range._end =
             parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                       (lprims->items,0,uVar46,0x400,(anon_class_8_1_41ce32a5 *)&bi);
      }
      local_1e68._4_4_ = time_range0.upper;
      local_1e68._0_4_ = time_range0.lower;
      local_1e68._8_8_ = 0;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&bi,&right);
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uVar44 >> 0x20;
      auVar57 = vcmpps_avx(auVar56,local_1e68,1);
      auVar71 = vinsertps_avx(local_1e68,auVar56,0x50);
      auVar61 = vblendps_avx(auVar56,local_1e68,2);
      auVar61 = vblendvps_avx(auVar61,auVar71,auVar57);
      vmovlps_avx(auVar61);
      SetMB::operator=((SetMB *)&blower1.upper,(SetMB *)&bi);
      uVar46 = children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._begin;
      bi.lower.field_0.m128[0] = INFINITY;
      bi.lower.field_0.m128[1] = INFINITY;
      bi.lower.field_0.m128[2] = INFINITY;
      bi.lower.field_0.m128[3] = INFINITY;
      bi.upper.field_0.m128[0] = -INFINITY;
      bi.upper.field_0.m128[1] = -INFINITY;
      bi.upper.field_0.m128[2] = -INFINITY;
      bi.upper.field_0.m128[3] = -INFINITY;
      local_1d88.i[0] = 0x7f800000;
      local_1d88.i[1] = 0x7f800000;
      local_1d88.i[2] = 0x7f800000;
      local_1d88.i[3] = 0x7f800000;
      aaStack_1d78[0].i[0] = -INFINITY;
      aaStack_1d78[0].i[1] = -INFINITY;
      aaStack_1d78[0].i[2] = -INFINITY;
      aaStack_1d78[0].i[3] = -INFINITY;
      auVar57._8_4_ = 0x3f800000;
      auVar57._0_8_ = 0x3f8000003f800000;
      auVar57._12_4_ = 0x3f800000;
      uVar44 = vmovlps_avx(auVar57);
      pcVar11 = (code *)children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.
                        object_range._end;
      _reduction2 = pmVar10;
      if ((long)pcVar11 - uVar46 < 0xc00) {
        vSplitPos.field_0.v[0] = uVar46;
        vSplitPos.field_0.v[1] = (longlong)pcVar11;
        ::anon_func::anon_class_24_3_35f68c7c::operator()
                  ((PrimInfoMB *)&isLeft,(anon_class_24_3_35f68c7c *)&reduction2,
                   (range<unsigned_long> *)&vSplitPos);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&vSplitPos,(context_traits)0x4,CUSTOM_CTX);
        local_1c88._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_1c88._8_8_ = &reduction2;
        _reduction = pcVar11;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&isLeft,(d1 *)&reduction,
                   (blocked_range<unsigned_long> *)&bi,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1c88,
                   (anon_class_16_2_ed117de8_conflict30 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&vSplitPos,in_stack_ffffffffffffe188);
        cVar28 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
        if (cVar28 != '\0') {
          prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar34,"task cancelled");
          __cxa_throw(prVar34,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&vSplitPos);
      }
      lVar29 = local_1a90 - local_1a98;
      local_1a98 = children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.
                   object_range._begin;
      local_1a90 = lVar29 + local_1a98;
      uVar46 = children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._end;
      if (lVar29 != uVar46 - local_1a98) {
        bi.lower.field_0._0_8_ = &time_range1;
        local_1a90 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                               (pmVar10->items,local_1a98,uVar46,0x400,
                                (anon_class_8_1_41ce32a6 *)&bi);
      }
      local_1e68._4_4_ = time_range1.upper;
      local_1e68._0_4_ = time_range1.lower;
      local_1e68._8_8_ = 0;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&bi,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&isLeft);
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar44 >> 0x20;
      auVar57 = vcmpps_avx(auVar58,local_1e68,1);
      auVar71 = vinsertps_avx(local_1e68,auVar58,0x50);
      auVar61 = vblendps_avx(auVar58,local_1e68,2);
      auVar61 = vblendvps_avx(auVar61,auVar71,auVar57);
      vmovlps_avx(auVar61);
      SetMB::operator=((SetMB *)&bupper0.upper,(SetMB *)&bi);
      bVar53 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl !=
               (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      goto LAB_00cd4789;
    case 3:
      SetMB::deterministic_order(this_00);
      splitByGeometry(this,this_00,(SetMB *)&blower1.upper,(SetMB *)&bupper0.upper);
    }
LAB_00cd4779:
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
    bVar53 = false;
LAB_00cd4789:
    findFallback((Split *)&bi,this,(SetMB *)&blower1.upper);
    findFallback((Split *)&bi,this,(SetMB *)&bupper0.upper);
    sVar43 = children.numSharedPrimVecs;
    local_1db8._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)new_vector._M_t.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl;
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
    pSVar7 = children.primvecs.items[sVar32];
    if (local_1b48 == pSVar7->prims) {
      pSVar7->refCount = pSVar7->refCount + 1;
      pvVar36 = local_1b48;
    }
    else {
      pSVar24 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      pSVar25 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
      pSVar25->prims = local_1b48;
      children.sharedPrimVecs.items[sVar43].refCount = 1;
      children.primvecs.items[sVar32] =
           (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)&pSVar24->prims;
      pvVar36 = pSVar7->prims;
    }
    sVar43 = children.numSharedPrimVecs;
    if (local_19c8 == pvVar36) {
      children.primvecs.items[children.numChildren] = pSVar7;
      sVar43 = pSVar7->refCount;
      pSVar7->refCount = sVar43 + 1;
    }
    else {
      pSVar24 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      pSVar25 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
      pSVar25->prims = local_19c8;
      children.sharedPrimVecs.items[sVar43].refCount = 1;
      children.primvecs.items[children.numChildren] =
           (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)&pSVar24->prims;
      sVar43 = pSVar7->refCount - 1;
    }
    pSVar7->refCount = sVar43;
    if (sVar43 == 0) {
      pvVar36 = pSVar7->prims;
      if (pvVar36 !=
          (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
           *)0x0) {
        sVar43 = pvVar36->size_alloced;
        pPVar8 = pvVar36->items;
        if (pPVar8 != (PrimRefMB *)0x0) {
          if (sVar43 * 0x50 < 0x1c00000) {
            alignedFree(pPVar8);
          }
          else {
            os_free(pPVar8,sVar43 * 0x50,(pvVar36->alloc).hugepages);
          }
        }
        if (sVar43 != 0) {
          pMVar9 = (pvVar36->alloc).device;
          (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar43 * -0x50,1);
        }
        pvVar36->size_active = 0;
        pvVar36->size_alloced = 0;
        pvVar36->items = (PrimRefMB *)0x0;
      }
      ::operator_delete(pvVar36);
    }
    local_1db8._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)0x0;
    BuildRecordSplit::operator=
              ((BuildRecordSplit *)&children.children.items[sVar32].super_BuildRecord,
               (BuildRecordSplit *)&blower1);
    BuildRecordSplit::operator=
              ((BuildRecordSplit *)&children.children.items[children.numChildren].super_BuildRecord,
               (BuildRecordSplit *)&bupper0);
    bVar27 = bVar27 | bVar53;
    children.numChildren = children.numChildren + 1;
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr((unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                   *)&local_1db8);
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr(&new_vector);
  } while (children.numChildren < (this->cfg).branchingFactor);
  in_00 = &children;
  pfVar37 = &children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
  sVar32 = children.numChildren;
  while (bVar53 = sVar32 != 0, sVar32 = sVar32 - 1, bVar53) {
    auVar61 = vcmpps_avx(ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.lower),
                         ZEXT416((uint)((BBox1f *)(pfVar37 + -1))->lower),1);
    auVar57 = vcmpps_avx(ZEXT416((uint)*pfVar37),
                         ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.upper),1);
    auVar61 = vorps_avx(auVar61,auVar57);
    bVar27 = bVar27 | auVar61[0];
    pfVar37 = pfVar37 + 0x3c;
  }
  if ((bVar27 & 1) == 0) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0xe0;
    pTVar12 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar12->alloc)._M_b._M_p) {
      bupper0.lower.field_0._8_1_ = 1;
      bupper0.lower.field_0._0_8_ = pTVar12;
      MutexSys::lock(&pTVar12->mutex);
      if ((pTVar12->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar12->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar12->alloc1).bytesUsed + (pTVar12->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar12->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar12->alloc0).end + (pTVar12->alloc1).end) -
             ((pTVar12->alloc0).cur + (pTVar12->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar12->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar12->alloc1).bytesWasted + (pTVar12->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar63 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar12->alloc0).end = auVar63._0_8_;
      (pTVar12->alloc0).allocBlockSize = auVar63._8_8_;
      (pTVar12->alloc0).bytesUsed = auVar63._16_8_;
      (pTVar12->alloc0).bytesWasted = auVar63._24_8_;
      (pTVar12->alloc0).ptr = (char *)auVar63._0_8_;
      (pTVar12->alloc0).cur = auVar63._8_8_;
      (pTVar12->alloc0).end = auVar63._16_8_;
      (pTVar12->alloc0).allocBlockSize = auVar63._24_8_;
      auVar63 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar12->alloc1).end = auVar63._0_8_;
        (pTVar12->alloc1).allocBlockSize = auVar63._8_8_;
        (pTVar12->alloc1).bytesUsed = auVar63._16_8_;
        (pTVar12->alloc1).bytesWasted = auVar63._24_8_;
        (pTVar12->alloc1).ptr = (char *)auVar63._0_8_;
        (pTVar12->alloc1).cur = auVar63._8_8_;
        (pTVar12->alloc1).end = auVar63._16_8_;
        (pTVar12->alloc1).allocBlockSize = auVar63._24_8_;
      }
      else {
        (pTVar12->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar12->alloc1).ptr = (char *)auVar63._0_8_;
        (pTVar12->alloc1).cur = auVar63._8_8_;
        (pTVar12->alloc1).end = auVar63._16_8_;
        (pTVar12->alloc1).allocBlockSize = auVar63._24_8_;
        (pTVar12->alloc1).end = auVar63._0_8_;
        (pTVar12->alloc1).allocBlockSize = auVar63._8_8_;
        (pTVar12->alloc1).bytesUsed = auVar63._16_8_;
        (pTVar12->alloc1).bytesWasted = auVar63._24_8_;
        (pTVar12->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar12->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      bi.lower.field_0.m128[0] = SUB84(pTVar12,0);
      bi.lower.field_0.m128[1] = (float)((ulong)pTVar12 >> 0x20);
      blower1.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      blower1.lower.field_0._8_1_ = 1;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&bi);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&blower1);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&bupper0);
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar32 = (alloc.talloc0)->cur;
    uVar44 = (ulong)(-(int)sVar32 & 0xf);
    uVar45 = sVar32 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar44;
    (alloc.talloc0)->cur = uVar45;
    if ((alloc.talloc0)->end < uVar45) {
      (alloc.talloc0)->cur = sVar32;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        blower1.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower1);
        (alloc.talloc0)->ptr = pcVar41;
        sVar32 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar32;
        (alloc.talloc0)->end = blower1.lower.field_0._0_8_;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)blower1.lower.field_0._0_8_ <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          blower1.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
          pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower1);
          (alloc.talloc0)->ptr = pcVar41;
          sVar32 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar32;
          (alloc.talloc0)->end = blower1.lower.field_0._0_8_;
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if ((ulong)blower1.lower.field_0._0_8_ <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar41 = (char *)0x0;
            goto LAB_00cd54f6;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar32;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar44;
      pcVar41 = (alloc.talloc0)->ptr +
                (uVar45 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_00cd54f6:
    pcVar41[0x60] = '\0';
    pcVar41[0x61] = '\0';
    pcVar41[0x62] = -0x80;
    pcVar41[99] = '\x7f';
    pcVar41[100] = '\0';
    pcVar41[0x65] = '\0';
    pcVar41[0x66] = -0x80;
    pcVar41[0x67] = '\x7f';
    pcVar41[0x68] = '\0';
    pcVar41[0x69] = '\0';
    pcVar41[0x6a] = -0x80;
    pcVar41[0x6b] = '\x7f';
    pcVar41[0x6c] = '\0';
    pcVar41[0x6d] = '\0';
    pcVar41[0x6e] = -0x80;
    pcVar41[0x6f] = '\x7f';
    pcVar41[0x40] = '\0';
    pcVar41[0x41] = '\0';
    pcVar41[0x42] = -0x80;
    pcVar41[0x43] = '\x7f';
    pcVar41[0x44] = '\0';
    pcVar41[0x45] = '\0';
    pcVar41[0x46] = -0x80;
    pcVar41[0x47] = '\x7f';
    pcVar41[0x48] = '\0';
    pcVar41[0x49] = '\0';
    pcVar41[0x4a] = -0x80;
    pcVar41[0x4b] = '\x7f';
    pcVar41[0x4c] = '\0';
    pcVar41[0x4d] = '\0';
    pcVar41[0x4e] = -0x80;
    pcVar41[0x4f] = '\x7f';
    pcVar41[0x20] = '\0';
    pcVar41[0x21] = '\0';
    pcVar41[0x22] = -0x80;
    pcVar41[0x23] = '\x7f';
    pcVar41[0x24] = '\0';
    pcVar41[0x25] = '\0';
    pcVar41[0x26] = -0x80;
    pcVar41[0x27] = '\x7f';
    pcVar41[0x28] = '\0';
    pcVar41[0x29] = '\0';
    pcVar41[0x2a] = -0x80;
    pcVar41[0x2b] = '\x7f';
    pcVar41[0x2c] = '\0';
    pcVar41[0x2d] = '\0';
    pcVar41[0x2e] = -0x80;
    pcVar41[0x2f] = '\x7f';
    pcVar41[0x70] = '\0';
    pcVar41[0x71] = '\0';
    pcVar41[0x72] = -0x80;
    pcVar41[0x73] = -1;
    pcVar41[0x74] = '\0';
    pcVar41[0x75] = '\0';
    pcVar41[0x76] = -0x80;
    pcVar41[0x77] = -1;
    pcVar41[0x78] = '\0';
    pcVar41[0x79] = '\0';
    pcVar41[0x7a] = -0x80;
    pcVar41[0x7b] = -1;
    pcVar41[0x7c] = '\0';
    pcVar41[0x7d] = '\0';
    pcVar41[0x7e] = -0x80;
    pcVar41[0x7f] = -1;
    pcVar41[0x50] = '\0';
    pcVar41[0x51] = '\0';
    pcVar41[0x52] = -0x80;
    pcVar41[0x53] = -1;
    pcVar41[0x54] = '\0';
    pcVar41[0x55] = '\0';
    pcVar41[0x56] = -0x80;
    pcVar41[0x57] = -1;
    pcVar41[0x58] = '\0';
    pcVar41[0x59] = '\0';
    pcVar41[0x5a] = -0x80;
    pcVar41[0x5b] = -1;
    pcVar41[0x5c] = '\0';
    pcVar41[0x5d] = '\0';
    pcVar41[0x5e] = -0x80;
    pcVar41[0x5f] = -1;
    pcVar41[0x30] = '\0';
    pcVar41[0x31] = '\0';
    pcVar41[0x32] = -0x80;
    pcVar41[0x33] = -1;
    pcVar41[0x34] = '\0';
    pcVar41[0x35] = '\0';
    pcVar41[0x36] = -0x80;
    pcVar41[0x37] = -1;
    pcVar41[0x38] = '\0';
    pcVar41[0x39] = '\0';
    pcVar41[0x3a] = -0x80;
    pcVar41[0x3b] = -1;
    pcVar41[0x3c] = '\0';
    pcVar41[0x3d] = '\0';
    pcVar41[0x3e] = -0x80;
    pcVar41[0x3f] = -1;
    auVar61 = ZEXT816(0);
    *(undefined1 (*) [32])(pcVar41 + 0x80) = ZEXT1632(auVar61);
    *(undefined1 (*) [32])(pcVar41 + 0xa0) = ZEXT1632(auVar61);
    *(undefined1 (*) [32])(pcVar41 + 0xc0) = ZEXT1632(auVar61);
    for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
      pcVar3 = pcVar41 + lVar29 * 8;
      pcVar3[0] = '\b';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
    }
    goto LAB_00cd5557;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x100;
  pTVar12 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar12->alloc)._M_b._M_p) {
    bupper0.lower.field_0._8_1_ = 1;
    bupper0.lower.field_0._0_8_ = pTVar12;
    MutexSys::lock(&pTVar12->mutex);
    if ((pTVar12->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar2 = &((pTVar12->alloc)._M_b._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar12->alloc1).bytesUsed + (pTVar12->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar12->alloc)._M_b._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar12->alloc0).end + (pTVar12->alloc1).end) -
           ((pTVar12->alloc0).cur + (pTVar12->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar12->alloc)._M_b._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar12->alloc1).bytesWasted + (pTVar12->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar63 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar12->alloc0).end = auVar63._0_8_;
    (pTVar12->alloc0).allocBlockSize = auVar63._8_8_;
    (pTVar12->alloc0).bytesUsed = auVar63._16_8_;
    (pTVar12->alloc0).bytesWasted = auVar63._24_8_;
    (pTVar12->alloc0).ptr = (char *)auVar63._0_8_;
    (pTVar12->alloc0).cur = auVar63._8_8_;
    (pTVar12->alloc0).end = auVar63._16_8_;
    (pTVar12->alloc0).allocBlockSize = auVar63._24_8_;
    auVar63 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar12->alloc1).end = auVar63._0_8_;
      (pTVar12->alloc1).allocBlockSize = auVar63._8_8_;
      (pTVar12->alloc1).bytesUsed = auVar63._16_8_;
      (pTVar12->alloc1).bytesWasted = auVar63._24_8_;
      (pTVar12->alloc1).ptr = (char *)auVar63._0_8_;
      (pTVar12->alloc1).cur = auVar63._8_8_;
      (pTVar12->alloc1).end = auVar63._16_8_;
      (pTVar12->alloc1).allocBlockSize = auVar63._24_8_;
    }
    else {
      (pTVar12->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar12->alloc1).ptr = (char *)auVar63._0_8_;
      (pTVar12->alloc1).cur = auVar63._8_8_;
      (pTVar12->alloc1).end = auVar63._16_8_;
      (pTVar12->alloc1).allocBlockSize = auVar63._24_8_;
      (pTVar12->alloc1).end = auVar63._0_8_;
      (pTVar12->alloc1).allocBlockSize = auVar63._8_8_;
      (pTVar12->alloc1).bytesUsed = auVar63._16_8_;
      (pTVar12->alloc1).bytesWasted = auVar63._24_8_;
      (pTVar12->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar12->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    bi.lower.field_0.m128[0] = SUB84(pTVar12,0);
    bi.lower.field_0.m128[1] = (float)((ulong)pTVar12 >> 0x20);
    blower1.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    blower1.lower.field_0._8_1_ = 1;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&bi);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&blower1);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&bupper0);
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar32 = (alloc.talloc0)->cur;
  uVar44 = (ulong)(-(int)sVar32 & 0xf);
  uVar45 = sVar32 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar44;
  (alloc.talloc0)->cur = uVar45;
  if ((alloc.talloc0)->end < uVar45) {
    (alloc.talloc0)->cur = sVar32;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      blower1.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
      pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower1);
      (alloc.talloc0)->ptr = pcVar41;
      sVar32 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar32;
      (alloc.talloc0)->end = blower1.lower.field_0._0_8_;
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      if ((ulong)blower1.lower.field_0._0_8_ <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        blower1.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower1);
        (alloc.talloc0)->ptr = pcVar41;
        sVar32 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar32;
        (alloc.talloc0)->end = blower1.lower.field_0._0_8_;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)blower1.lower.field_0._0_8_ <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar41 = (char *)0x0;
          goto LAB_00cd53d6;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar32;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar44;
    pcVar41 = (alloc.talloc0)->ptr +
              (uVar45 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_00cd53d6:
  pcVar41[0xe0] = '\0';
  pcVar41[0xe1] = '\0';
  pcVar41[0xe2] = -0x80;
  pcVar41[0xe3] = '\x7f';
  pcVar41[0xe4] = '\0';
  pcVar41[0xe5] = '\0';
  pcVar41[0xe6] = -0x80;
  pcVar41[0xe7] = '\x7f';
  pcVar41[0xe8] = '\0';
  pcVar41[0xe9] = '\0';
  pcVar41[0xea] = -0x80;
  pcVar41[0xeb] = '\x7f';
  pcVar41[0xec] = '\0';
  pcVar41[0xed] = '\0';
  pcVar41[0xee] = -0x80;
  pcVar41[0xef] = '\x7f';
  pcVar41[0xf0] = '\0';
  pcVar41[0xf1] = '\0';
  pcVar41[0xf2] = -0x80;
  pcVar41[0xf3] = -1;
  pcVar41[0xf4] = '\0';
  pcVar41[0xf5] = '\0';
  pcVar41[0xf6] = -0x80;
  pcVar41[0xf7] = -1;
  pcVar41[0xf8] = '\0';
  pcVar41[0xf9] = '\0';
  pcVar41[0xfa] = -0x80;
  pcVar41[0xfb] = -1;
  pcVar41[0xfc] = '\0';
  pcVar41[0xfd] = '\0';
  pcVar41[0xfe] = -0x80;
  pcVar41[0xff] = -1;
  pcVar41[0x60] = '\0';
  pcVar41[0x61] = '\0';
  pcVar41[0x62] = -0x80;
  pcVar41[99] = '\x7f';
  pcVar41[100] = '\0';
  pcVar41[0x65] = '\0';
  pcVar41[0x66] = -0x80;
  pcVar41[0x67] = '\x7f';
  pcVar41[0x68] = '\0';
  pcVar41[0x69] = '\0';
  pcVar41[0x6a] = -0x80;
  pcVar41[0x6b] = '\x7f';
  pcVar41[0x6c] = '\0';
  pcVar41[0x6d] = '\0';
  pcVar41[0x6e] = -0x80;
  pcVar41[0x6f] = '\x7f';
  pcVar41[0x40] = '\0';
  pcVar41[0x41] = '\0';
  pcVar41[0x42] = -0x80;
  pcVar41[0x43] = '\x7f';
  pcVar41[0x44] = '\0';
  pcVar41[0x45] = '\0';
  pcVar41[0x46] = -0x80;
  pcVar41[0x47] = '\x7f';
  pcVar41[0x48] = '\0';
  pcVar41[0x49] = '\0';
  pcVar41[0x4a] = -0x80;
  pcVar41[0x4b] = '\x7f';
  pcVar41[0x4c] = '\0';
  pcVar41[0x4d] = '\0';
  pcVar41[0x4e] = -0x80;
  pcVar41[0x4f] = '\x7f';
  pcVar41[0x20] = '\0';
  pcVar41[0x21] = '\0';
  pcVar41[0x22] = -0x80;
  pcVar41[0x23] = '\x7f';
  pcVar41[0x24] = '\0';
  pcVar41[0x25] = '\0';
  pcVar41[0x26] = -0x80;
  pcVar41[0x27] = '\x7f';
  pcVar41[0x28] = '\0';
  pcVar41[0x29] = '\0';
  pcVar41[0x2a] = -0x80;
  pcVar41[0x2b] = '\x7f';
  pcVar41[0x2c] = '\0';
  pcVar41[0x2d] = '\0';
  pcVar41[0x2e] = -0x80;
  pcVar41[0x2f] = '\x7f';
  pcVar41[0x70] = '\0';
  pcVar41[0x71] = '\0';
  pcVar41[0x72] = -0x80;
  pcVar41[0x73] = -1;
  pcVar41[0x74] = '\0';
  pcVar41[0x75] = '\0';
  pcVar41[0x76] = -0x80;
  pcVar41[0x77] = -1;
  pcVar41[0x78] = '\0';
  pcVar41[0x79] = '\0';
  pcVar41[0x7a] = -0x80;
  pcVar41[0x7b] = -1;
  pcVar41[0x7c] = '\0';
  pcVar41[0x7d] = '\0';
  pcVar41[0x7e] = -0x80;
  pcVar41[0x7f] = -1;
  pcVar41[0x50] = '\0';
  pcVar41[0x51] = '\0';
  pcVar41[0x52] = -0x80;
  pcVar41[0x53] = -1;
  pcVar41[0x54] = '\0';
  pcVar41[0x55] = '\0';
  pcVar41[0x56] = -0x80;
  pcVar41[0x57] = -1;
  pcVar41[0x58] = '\0';
  pcVar41[0x59] = '\0';
  pcVar41[0x5a] = -0x80;
  pcVar41[0x5b] = -1;
  pcVar41[0x5c] = '\0';
  pcVar41[0x5d] = '\0';
  pcVar41[0x5e] = -0x80;
  pcVar41[0x5f] = -1;
  pcVar41[0x30] = '\0';
  pcVar41[0x31] = '\0';
  pcVar41[0x32] = -0x80;
  pcVar41[0x33] = -1;
  pcVar41[0x34] = '\0';
  pcVar41[0x35] = '\0';
  pcVar41[0x36] = -0x80;
  pcVar41[0x37] = -1;
  pcVar41[0x38] = '\0';
  pcVar41[0x39] = '\0';
  pcVar41[0x3a] = -0x80;
  pcVar41[0x3b] = -1;
  pcVar41[0x3c] = '\0';
  pcVar41[0x3d] = '\0';
  pcVar41[0x3e] = -0x80;
  pcVar41[0x3f] = -1;
  auVar61 = ZEXT816(0);
  *(undefined1 (*) [32])(pcVar41 + 0x80) = ZEXT1632(auVar61);
  *(undefined1 (*) [32])(pcVar41 + 0xa0) = ZEXT1632(auVar61);
  *(undefined1 (*) [32])(pcVar41 + 0xc0) = ZEXT1632(auVar61);
  local_1e40 = 6;
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pcVar3 = pcVar41 + lVar29 * 8;
    pcVar3[0] = '\b';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
  }
LAB_00cd5557:
  local_1e40 = local_1e40 | (ulong)pcVar41;
  pBVar50 = &values[0].dt;
  local_1e58._8_4_ = 0xff800000;
  local_1e58._0_8_ = 0xff800000ff800000;
  local_1e58._12_4_ = 0xff800000;
  local_1e68._8_4_ = 0x7f800000;
  local_1e68._0_8_ = 0x7f8000007f800000;
  local_1e68._12_4_ = 0x7f800000;
  for (uVar44 = 0; uVar44 < children.numChildren; uVar44 = uVar44 + 1) {
    createLargeLeaf((NodeRecordMB4D *)&blower1,this,(BuildRecord *)in_00,alloc);
    pBVar50[-10].lower = (float)blower1.lower.field_0._0_4_;
    pBVar50[-10].upper = (float)blower1.lower.field_0._4_4_;
    auVar21._4_4_ = blower1.upper.field_0.m128[1];
    auVar21._0_4_ = blower1.upper.field_0.m128[0];
    auVar21._8_4_ = blower1.upper.field_0.m128[2];
    auVar21._12_4_ = blower1.upper.field_0.m128[3];
    *(undefined1 (*) [16])(pBVar50 + -8) = auVar21;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar50 + -6) = local_1bc8;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar50 + -4) = local_1bb8;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar50 + -2) = local_1ba8;
    pBVar50->lower = (float)local_1b98[0]._0_4_;
    pBVar50->upper = (float)local_1b98[0]._4_4_;
    local_1e68 = vminps_avx(local_1e68,auVar21);
    local_1e58 = vmaxps_avx(local_1e58,(undefined1  [16])local_1bc8);
    local_1dd8 = vminps_avx(local_1dd8,(undefined1  [16])local_1bb8);
    local_1e18 = vmaxps_avx(local_1e18,(undefined1  [16])local_1ba8);
    in_00 = (LocalChildListSplit *)((in_00->children).items + 1);
    pBVar50 = pBVar50 + 0xc;
  }
  uVar44 = (ulong)pcVar41 & 0xfffffffffffffff0;
  if (((uint)local_1e40 & 0xf) == 1) {
    pfVar37 = &values[0].dt.upper;
    auVar68._8_4_ = 0x7f7fffff;
    auVar68._0_8_ = 0x7f7fffff7f7fffff;
    auVar68._12_4_ = 0x7f7fffff;
    auVar72._8_4_ = 0xff7fffff;
    auVar72._0_8_ = 0xff7fffffff7fffff;
    auVar72._12_4_ = 0xff7fffff;
    auVar74._8_4_ = 0x7fffffff;
    auVar74._0_8_ = 0x7fffffff7fffffff;
    auVar74._12_4_ = 0x7fffffff;
    for (sVar32 = 0; children.numChildren != sVar32; sVar32 = sVar32 + 1) {
      *(undefined8 *)(uVar44 + sVar32 * 8) = *(undefined8 *)(pfVar37 + -0x15);
      fVar4 = ((BBox1f *)(pfVar37 + -1))->lower;
      fVar82 = 1.0 / (*pfVar37 - fVar4);
      fVar77 = -fVar4 * fVar82;
      auVar61 = vshufps_avx(ZEXT416((uint)fVar77),ZEXT416((uint)fVar77),0);
      auVar57 = vshufps_avx(ZEXT416((uint)(1.0 - fVar77)),ZEXT416((uint)(1.0 - fVar77)),0);
      auVar107._0_4_ = pfVar37[-9] * auVar61._0_4_ + pfVar37[-0x11] * auVar57._0_4_;
      auVar107._4_4_ = pfVar37[-8] * auVar61._4_4_ + pfVar37[-0x10] * auVar57._4_4_;
      auVar107._8_4_ = pfVar37[-7] * auVar61._8_4_ + pfVar37[-0xf] * auVar57._8_4_;
      auVar107._12_4_ = pfVar37[-6] * auVar61._12_4_ + pfVar37[-0xe] * auVar57._12_4_;
      auVar90._0_4_ = pfVar37[-5] * auVar61._0_4_ + pfVar37[-0xd] * auVar57._0_4_;
      auVar90._4_4_ = pfVar37[-4] * auVar61._4_4_ + pfVar37[-0xc] * auVar57._4_4_;
      auVar90._8_4_ = pfVar37[-3] * auVar61._8_4_ + pfVar37[-0xb] * auVar57._8_4_;
      auVar90._12_4_ = pfVar37[-2] * auVar61._12_4_ + pfVar37[-10] * auVar57._12_4_;
      fVar82 = (1.0 - fVar4) * fVar82;
      auVar61 = vshufps_avx(ZEXT416((uint)fVar82),ZEXT416((uint)fVar82),0);
      auVar57 = vshufps_avx(ZEXT416((uint)(1.0 - fVar82)),ZEXT416((uint)(1.0 - fVar82)),0);
      auVar93._0_4_ = pfVar37[-9] * auVar61._0_4_ + pfVar37[-0x11] * auVar57._0_4_;
      auVar93._4_4_ = pfVar37[-8] * auVar61._4_4_ + pfVar37[-0x10] * auVar57._4_4_;
      auVar93._8_4_ = pfVar37[-7] * auVar61._8_4_ + pfVar37[-0xf] * auVar57._8_4_;
      auVar93._12_4_ = pfVar37[-6] * auVar61._12_4_ + pfVar37[-0xe] * auVar57._12_4_;
      auVar83._0_4_ = pfVar37[-5] * auVar61._0_4_ + pfVar37[-0xd] * auVar57._0_4_;
      auVar83._4_4_ = pfVar37[-4] * auVar61._4_4_ + pfVar37[-0xc] * auVar57._4_4_;
      auVar83._8_4_ = pfVar37[-3] * auVar61._8_4_ + pfVar37[-0xb] * auVar57._8_4_;
      auVar83._12_4_ = pfVar37[-2] * auVar61._12_4_ + pfVar37[-10] * auVar57._12_4_;
      auVar70 = vminps_avx(auVar107,auVar68);
      auVar57 = vmaxps_avx(auVar90,auVar72);
      auVar56 = vminps_avx(auVar93,auVar68);
      auVar71 = vmaxps_avx(auVar83,auVar72);
      auVar61 = vandps_avx(auVar70,auVar74);
      auVar100._0_4_ = auVar61._0_4_ * 4.7683716e-07;
      auVar100._4_4_ = auVar61._4_4_ * 4.7683716e-07;
      auVar100._8_4_ = auVar61._8_4_ * 4.7683716e-07;
      auVar100._12_4_ = auVar61._12_4_ * 4.7683716e-07;
      auVar70 = vsubps_avx(auVar70,auVar100);
      auVar61 = vandps_avx(auVar57,auVar74);
      auVar91._0_4_ = auVar57._0_4_ + auVar61._0_4_ * 4.7683716e-07;
      auVar91._4_4_ = auVar57._4_4_ + auVar61._4_4_ * 4.7683716e-07;
      auVar91._8_4_ = auVar57._8_4_ + auVar61._8_4_ * 4.7683716e-07;
      auVar91._12_4_ = auVar57._12_4_ + auVar61._12_4_ * 4.7683716e-07;
      auVar61 = vandps_avx(auVar56,auVar74);
      auVar101._0_4_ = auVar61._0_4_ * 4.7683716e-07;
      auVar101._4_4_ = auVar61._4_4_ * 4.7683716e-07;
      auVar101._8_4_ = auVar61._8_4_ * 4.7683716e-07;
      auVar101._12_4_ = auVar61._12_4_ * 4.7683716e-07;
      auVar57 = vsubps_avx(auVar56,auVar101);
      auVar61 = vandps_avx(auVar71,auVar74);
      *(int *)(uVar44 + 0x20 + sVar32 * 4) = auVar70._0_4_;
      uVar6 = vextractps_avx(auVar70,1);
      *(undefined4 *)(uVar44 + 0x40 + sVar32 * 4) = uVar6;
      auVar84._0_4_ = auVar61._0_4_ * 4.7683716e-07 + auVar71._0_4_;
      auVar84._4_4_ = auVar61._4_4_ * 4.7683716e-07 + auVar71._4_4_;
      auVar84._8_4_ = auVar61._8_4_ * 4.7683716e-07 + auVar71._8_4_;
      auVar84._12_4_ = auVar61._12_4_ * 4.7683716e-07 + auVar71._12_4_;
      uVar6 = vextractps_avx(auVar70,2);
      *(undefined4 *)(uVar44 + 0x60 + sVar32 * 4) = uVar6;
      *(float *)(uVar44 + 0x30 + sVar32 * 4) = auVar91._0_4_;
      uVar6 = vextractps_avx(auVar91,1);
      *(undefined4 *)(uVar44 + 0x50 + sVar32 * 4) = uVar6;
      auVar61 = vsubps_avx(auVar57,auVar70);
      uVar6 = vextractps_avx(auVar91,2);
      *(undefined4 *)(uVar44 + 0x70 + sVar32 * 4) = uVar6;
      *(int *)(uVar44 + 0x80 + sVar32 * 4) = auVar61._0_4_;
      uVar6 = vextractps_avx(auVar61,1);
      *(undefined4 *)(uVar44 + 0xa0 + sVar32 * 4) = uVar6;
      auVar57 = vsubps_avx(auVar84,auVar91);
      uVar6 = vextractps_avx(auVar61,2);
      *(undefined4 *)(uVar44 + 0xc0 + sVar32 * 4) = uVar6;
      *(int *)(uVar44 + 0x90 + sVar32 * 4) = auVar57._0_4_;
      uVar6 = vextractps_avx(auVar57,1);
      *(undefined4 *)(uVar44 + 0xb0 + sVar32 * 4) = uVar6;
      uVar6 = vextractps_avx(auVar57,2);
      *(undefined4 *)(uVar44 + 0xd0 + sVar32 * 4) = uVar6;
      pfVar37 = pfVar37 + 0x18;
    }
  }
  else {
    pfVar37 = &values[0].dt.upper;
    auVar69._8_4_ = 0x7f7fffff;
    auVar69._0_8_ = 0x7f7fffff7f7fffff;
    auVar69._12_4_ = 0x7f7fffff;
    auVar73._8_4_ = 0xff7fffff;
    auVar73._0_8_ = 0xff7fffffff7fffff;
    auVar73._12_4_ = 0xff7fffff;
    auVar76._8_4_ = 0x7fffffff;
    auVar76._0_8_ = 0x7fffffff7fffffff;
    auVar76._12_4_ = 0x7fffffff;
    auVar85._8_4_ = 0x3f800001;
    auVar85._0_8_ = 0x3f8000013f800001;
    auVar85._12_4_ = 0x3f800001;
    for (sVar32 = 0; children.numChildren != sVar32; sVar32 = sVar32 + 1) {
      *(undefined8 *)(uVar44 + sVar32 * 8) = *(undefined8 *)(pfVar37 + -0x15);
      fVar4 = *pfVar37;
      fVar77 = ((BBox1f *)(pfVar37 + -1))->lower;
      fVar92 = 1.0 / (fVar4 - fVar77);
      fVar82 = fVar92 * -fVar77;
      auVar61 = vshufps_avx(ZEXT416((uint)fVar82),ZEXT416((uint)fVar82),0);
      auVar57 = vshufps_avx(ZEXT416((uint)(1.0 - fVar82)),ZEXT416((uint)(1.0 - fVar82)),0);
      auVar65._0_4_ = pfVar37[-9] * auVar61._0_4_ + pfVar37[-0x11] * auVar57._0_4_;
      auVar65._4_4_ = pfVar37[-8] * auVar61._4_4_ + pfVar37[-0x10] * auVar57._4_4_;
      auVar65._8_4_ = pfVar37[-7] * auVar61._8_4_ + pfVar37[-0xf] * auVar57._8_4_;
      auVar65._12_4_ = pfVar37[-6] * auVar61._12_4_ + pfVar37[-0xe] * auVar57._12_4_;
      auVar102._0_4_ = pfVar37[-5] * auVar61._0_4_ + pfVar37[-0xd] * auVar57._0_4_;
      auVar102._4_4_ = pfVar37[-4] * auVar61._4_4_ + pfVar37[-0xc] * auVar57._4_4_;
      auVar102._8_4_ = pfVar37[-3] * auVar61._8_4_ + pfVar37[-0xb] * auVar57._8_4_;
      auVar102._12_4_ = pfVar37[-2] * auVar61._12_4_ + pfVar37[-10] * auVar57._12_4_;
      fVar92 = (1.0 - fVar77) * fVar92;
      auVar61 = vshufps_avx(ZEXT416((uint)fVar92),ZEXT416((uint)fVar92),0);
      auVar57 = vshufps_avx(ZEXT416((uint)(1.0 - fVar92)),ZEXT416((uint)(1.0 - fVar92)),0);
      auVar104._0_4_ = pfVar37[-9] * auVar61._0_4_ + pfVar37[-0x11] * auVar57._0_4_;
      auVar104._4_4_ = pfVar37[-8] * auVar61._4_4_ + pfVar37[-0x10] * auVar57._4_4_;
      auVar104._8_4_ = pfVar37[-7] * auVar61._8_4_ + pfVar37[-0xf] * auVar57._8_4_;
      auVar104._12_4_ = pfVar37[-6] * auVar61._12_4_ + pfVar37[-0xe] * auVar57._12_4_;
      auVar95._0_4_ = pfVar37[-5] * auVar61._0_4_ + pfVar37[-0xd] * auVar57._0_4_;
      auVar95._4_4_ = pfVar37[-4] * auVar61._4_4_ + pfVar37[-0xc] * auVar57._4_4_;
      auVar95._8_4_ = pfVar37[-3] * auVar61._8_4_ + pfVar37[-0xb] * auVar57._8_4_;
      auVar95._12_4_ = pfVar37[-2] * auVar61._12_4_ + pfVar37[-10] * auVar57._12_4_;
      auVar70 = vminps_avx(auVar65,auVar69);
      auVar57 = vmaxps_avx(auVar102,auVar73);
      auVar56 = vminps_avx(auVar104,auVar69);
      auVar71 = vmaxps_avx(auVar95,auVar73);
      auVar61 = vandps_avx(auVar70,auVar76);
      auVar105._0_4_ = auVar61._0_4_ * 4.7683716e-07;
      auVar105._4_4_ = auVar61._4_4_ * 4.7683716e-07;
      auVar105._8_4_ = auVar61._8_4_ * 4.7683716e-07;
      auVar105._12_4_ = auVar61._12_4_ * 4.7683716e-07;
      auVar70 = vsubps_avx(auVar70,auVar105);
      auVar61 = vandps_avx(auVar57,auVar76);
      auVar103._0_4_ = auVar57._0_4_ + auVar61._0_4_ * 4.7683716e-07;
      auVar103._4_4_ = auVar57._4_4_ + auVar61._4_4_ * 4.7683716e-07;
      auVar103._8_4_ = auVar57._8_4_ + auVar61._8_4_ * 4.7683716e-07;
      auVar103._12_4_ = auVar57._12_4_ + auVar61._12_4_ * 4.7683716e-07;
      auVar61 = vandps_avx(auVar56,auVar76);
      auVar106._0_4_ = auVar61._0_4_ * 4.7683716e-07;
      auVar106._4_4_ = auVar61._4_4_ * 4.7683716e-07;
      auVar106._8_4_ = auVar61._8_4_ * 4.7683716e-07;
      auVar106._12_4_ = auVar61._12_4_ * 4.7683716e-07;
      auVar57 = vsubps_avx(auVar56,auVar106);
      auVar61 = vandps_avx(auVar71,auVar76);
      *(int *)(uVar44 + 0x20 + sVar32 * 4) = auVar70._0_4_;
      uVar6 = vextractps_avx(auVar70,1);
      *(undefined4 *)(uVar44 + 0x40 + sVar32 * 4) = uVar6;
      auVar96._0_4_ = auVar71._0_4_ + auVar61._0_4_ * 4.7683716e-07;
      auVar96._4_4_ = auVar71._4_4_ + auVar61._4_4_ * 4.7683716e-07;
      auVar96._8_4_ = auVar71._8_4_ + auVar61._8_4_ * 4.7683716e-07;
      auVar96._12_4_ = auVar71._12_4_ + auVar61._12_4_ * 4.7683716e-07;
      uVar6 = vextractps_avx(auVar70,2);
      *(undefined4 *)(uVar44 + 0x60 + sVar32 * 4) = uVar6;
      *(float *)(uVar44 + 0x30 + sVar32 * 4) = auVar103._0_4_;
      uVar6 = vextractps_avx(auVar103,1);
      *(undefined4 *)(uVar44 + 0x50 + sVar32 * 4) = uVar6;
      auVar61 = vsubps_avx(auVar57,auVar70);
      uVar6 = vextractps_avx(auVar103,2);
      *(undefined4 *)(uVar44 + 0x70 + sVar32 * 4) = uVar6;
      *(int *)(uVar44 + 0x80 + sVar32 * 4) = auVar61._0_4_;
      uVar6 = vextractps_avx(auVar61,1);
      *(undefined4 *)(uVar44 + 0xa0 + sVar32 * 4) = uVar6;
      auVar57 = vsubps_avx(auVar96,auVar103);
      uVar6 = vextractps_avx(auVar61,2);
      *(undefined4 *)(uVar44 + 0xc0 + sVar32 * 4) = uVar6;
      *(int *)(uVar44 + 0x90 + sVar32 * 4) = auVar57._0_4_;
      uVar6 = vextractps_avx(auVar57,1);
      *(undefined4 *)(uVar44 + 0xb0 + sVar32 * 4) = uVar6;
      uVar6 = vextractps_avx(auVar57,2);
      *(undefined4 *)(uVar44 + 0xd0 + sVar32 * 4) = uVar6;
      auVar61 = vcmpss_avx(ZEXT416((uint)fVar4),SUB6416(ZEXT464(0x3f800000),0),0);
      auVar61 = vblendvps_avx(ZEXT416((uint)fVar4),auVar85,auVar61);
      *(float *)(uVar44 + 0xe0 + sVar32 * 4) = fVar77;
      *(int *)(uVar44 + 0xf0 + sVar32 * 4) = auVar61._0_4_;
      pfVar37 = pfVar37 + 0x18;
    }
  }
  if ((bVar27 & 1) == 0) {
    (__return_storage_ptr__->ref).ptr = local_1e40;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1e68._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         local_1e68._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1e58._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1e58._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1dd8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1dd8._8_8_;
  }
  else {
    vSplitPos.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos.field_0.v[0] = (longlong)&current.super_BuildRecord.prims;
    bupper0.lower.field_0._0_8_ = 0x7f8000007f800000;
    bupper0.lower.field_0.m128[2] = INFINITY;
    bupper0.lower.field_0.m128[3] = INFINITY;
    bupper0.upper.field_0.m128[0] = -INFINITY;
    bupper0.upper.field_0.m128[1] = -INFINITY;
    bupper0.upper.field_0.m128[2] = -INFINITY;
    bupper0.upper.field_0.m128[3] = -INFINITY;
    if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end -
        current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin < 0xc00) {
      blower1.lower.field_0._0_8_ =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
      blower1.lower.field_0._8_8_ =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&bi,(anon_class_16_2_aeee9775 *)&vSplitPos,
                 (range<unsigned_long> *)&blower1);
    }
    else {
      tbb::detail::d1::task_group_context::task_group_context
                ((task_group_context *)&blower1,(context_traits)0x4,CUSTOM_CTX);
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::UserGeometry>>(embree::avx::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::UserGeometry>>(embree::avx::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::UserGeometry>>(embree::avx::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::UserGeometry>>(embree::avx::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::UserGeometry>>(embree::avx::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&bi,(d1 *)&right,(blocked_range<unsigned_long> *)&bupper0,
                 (LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,
                 (anon_class_1_0_00000001 *)&blower1,in_stack_ffffffffffffe188);
      cVar28 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&blower1);
      if (cVar28 != '\0') {
        prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar34,"task cancelled");
        __cxa_throw(prVar34,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&blower1);
    }
    (__return_storage_ptr__->ref).ptr = local_1e40;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = bi.lower.field_0._0_8_
    ;
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         CONCAT44(bi.lower.field_0.m128[3],bi.lower.field_0.m128[2]);
    *(ulong *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 =
         CONCAT44(bi.upper.field_0.m128[1],bi.upper.field_0.m128[0]);
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         CONCAT44(bi.upper.field_0.m128[3],bi.upper.field_0.m128[2]);
    *(ulong *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 =
         CONCAT44(local_1d88.i[1],local_1d88.i[0]);
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         CONCAT44(local_1d88.i[3],local_1d88.i[2]);
    local_1e18._0_8_ = CONCAT44(aaStack_1d78[0].i[1],aaStack_1d78[0].i[0]);
    local_1e18._8_8_ = CONCAT44(aaStack_1d78[0].i[3],aaStack_1d78[0].i[2]);
  }
  *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1e18._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
       local_1e18._8_8_;
  BVar23.upper = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
  BVar23.lower = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
  __return_storage_ptr__->dt = BVar23;
  for (uVar44 = 0; uVar44 < children.numChildren; uVar44 = uVar44 + 1) {
    pSVar7 = children.primvecs.items[uVar44];
    psVar1 = &pSVar7->refCount;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      pvVar36 = pSVar7->prims;
      if (pvVar36 !=
          (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
           *)0x0) {
        sVar32 = pvVar36->size_alloced;
        pPVar8 = pvVar36->items;
        if (pPVar8 != (PrimRefMB *)0x0) {
          if (sVar32 * 0x50 < 0x1c00000) {
            alignedFree(pPVar8);
          }
          else {
            os_free(pPVar8,sVar32 * 0x50,(pvVar36->alloc).hugepages);
          }
        }
        if (sVar32 != 0) {
          pMVar9 = (pvVar36->alloc).device;
          (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar32 * -0x50,1);
        }
        pvVar36->size_active = 0;
        pvVar36->size_alloced = 0;
        pvVar36->items = (PrimRefMB *)0x0;
      }
      ::operator_delete(pvVar36);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }